

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

bool __thiscall
pybind11::detail::type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
          (type_caster_generic *this,handle src,bool convert)

{
  _func__object_ptr__object_ptr__typeobject_ptr *p_Var1;
  vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_> *this_00;
  PyTypeObject *pPVar2;
  bool bVar3;
  int iVar4;
  PyObject **ppPVar5;
  size_type sVar6;
  const_reference pptVar7;
  reference pptVar8;
  vector<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
  *this_01;
  _object *ptr;
  uint local_174;
  type_index local_148;
  type_info *local_140;
  type_info *gtype;
  uint local_12c;
  PyObject *local_128;
  PyObject *local_110;
  handle local_108;
  handle local_100;
  object temp;
  _func__object_ptr__object_ptr__typeobject_ptr **converter;
  const_iterator __end4;
  const_iterator __begin4;
  vector<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
  *__range4;
  value_and_holder local_d0;
  type_info *local_b0;
  type_info *base;
  const_iterator __end7;
  const_iterator __begin7;
  vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_> *__range7;
  byte local_69;
  vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_> *pvStack_68;
  bool no_cpp_mi;
  vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_> *bases;
  PyTypeObject *local_40;
  PyTypeObject *srctype;
  type_caster_generic *this_;
  byte local_21;
  type_caster_generic *ptStack_20;
  bool convert_local;
  type_caster_generic *this_local;
  handle src_local;
  
  local_21 = convert;
  ptStack_20 = this;
  this_local = (type_caster_generic *)src.m_ptr;
  bVar3 = handle::operator_cast_to_bool((handle *)&this_local);
  if (bVar3) {
    if (this->typeinfo == (type_info *)0x0) {
      this_ = this_local;
      src_local.m_ptr._7_1_ = try_load_foreign_module_local(this,(handle)this_local);
    }
    else {
      bVar3 = object_api<pybind11::handle>::is_none((object_api<pybind11::handle> *)&this_local);
      if (bVar3) {
        if ((local_21 & 1) == 0) {
          src_local.m_ptr._7_1_ = 0;
        }
        else {
          this->value = (void *)0x0;
          src_local.m_ptr._7_1_ = 1;
        }
      }
      else {
        srctype = (PyTypeObject *)this;
        check_holder_compat(this);
        ppPVar5 = handle::ptr((handle *)&this_local);
        pPVar2 = srctype;
        local_40 = (*ppPVar5)->ob_type;
        if (local_40 == this->typeinfo->type) {
          ppPVar5 = handle::ptr((handle *)&this_local);
          instance::get_value_and_holder
                    ((value_and_holder *)&bases,(instance *)*ppPVar5,(type_info *)0x0,true);
          load_value((type_caster_generic *)pPVar2,(value_and_holder *)&bases);
          src_local.m_ptr._7_1_ = 1;
        }
        else {
          iVar4 = PyType_IsSubtype(local_40,this->typeinfo->type);
          if (iVar4 != 0) {
            pvStack_68 = all_type_info(local_40);
            local_69 = this->typeinfo->field_0x90 & 1;
            sVar6 = std::
                    vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                    ::size(pvStack_68);
            if ((sVar6 == 1) &&
               (((local_69 & 1) != 0 ||
                (pptVar7 = std::
                           vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                           ::front(pvStack_68), (*pptVar7)->type == this->typeinfo->type)))) {
              pPVar2 = srctype;
              ppPVar5 = handle::ptr((handle *)&this_local);
              instance::get_value_and_holder
                        ((value_and_holder *)&__range7,(instance *)*ppPVar5,(type_info *)0x0,true);
              load_value((type_caster_generic *)pPVar2,(value_and_holder *)&__range7);
              src_local.m_ptr._7_1_ = 1;
              goto LAB_0013ffe4;
            }
            sVar6 = std::
                    vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                    ::size(pvStack_68);
            this_00 = pvStack_68;
            if (1 < sVar6) {
              __end7 = std::
                       vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                       ::begin(pvStack_68);
              base = (type_info *)
                     std::
                     vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                     ::end(this_00);
              while (bVar3 = __gnu_cxx::operator!=
                                       (&__end7,(__normal_iterator<pybind11::detail::type_info_*const_*,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>
                                                 *)&base), bVar3) {
                pptVar8 = __gnu_cxx::
                          __normal_iterator<pybind11::detail::type_info_*const_*,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>
                          ::operator*(&__end7);
                local_b0 = *pptVar8;
                if ((local_69 & 1) == 0) {
                  local_174 = (uint)(local_b0->type == this->typeinfo->type);
                }
                else {
                  local_174 = PyType_IsSubtype(local_b0->type,this->typeinfo->type);
                }
                pPVar2 = srctype;
                if (local_174 != 0) {
                  ppPVar5 = handle::ptr((handle *)&this_local);
                  instance::get_value_and_holder(&local_d0,(instance *)*ppPVar5,local_b0,true);
                  load_value((type_caster_generic *)pPVar2,&local_d0);
                  src_local.m_ptr._7_1_ = 1;
                  goto LAB_0013ffe4;
                }
                __gnu_cxx::
                __normal_iterator<pybind11::detail::type_info_*const_*,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>
                ::operator++(&__end7);
              }
            }
            bVar3 = try_implicit_casts((type_caster_generic *)srctype,(handle)this_local,
                                       (bool)(local_21 & 1));
            if (bVar3) {
              src_local.m_ptr._7_1_ = 1;
              goto LAB_0013ffe4;
            }
          }
          if ((local_21 & 1) != 0) {
            this_01 = &this->typeinfo->implicit_conversions;
            __end4 = std::
                     vector<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
                     ::begin(this_01);
            converter = (_func__object_ptr__object_ptr__typeobject_ptr **)
                        std::
                        vector<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
                        ::end(this_01);
            while (bVar3 = __gnu_cxx::operator!=
                                     (&__end4,(__normal_iterator<_object_*(*const_*)(_object_*,__typeobject_*),_std::vector<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>_>
                                               *)&converter), bVar3) {
              temp.super_handle.m_ptr =
                   (handle)__gnu_cxx::
                           __normal_iterator<_object_*(*const_*)(_object_*,__typeobject_*),_std::vector<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>_>
                           ::operator*(&__end4);
              p_Var1 = (_func__object_ptr__object_ptr__typeobject_ptr *)
                       ((PyObject *)temp.super_handle.m_ptr)->ob_refcnt;
              ppPVar5 = handle::ptr((handle *)&this_local);
              ptr = (*p_Var1)(*ppPVar5,this->typeinfo->type);
              handle::handle(&local_108,ptr);
              reinterpret_steal<pybind11::object>((pybind11 *)&local_100,local_108);
              local_110 = local_100.m_ptr;
              bVar3 = load_impl<pybind11::detail::type_caster_generic>(this,local_100,false);
              if (bVar3) {
                local_128 = local_100.m_ptr;
                loader_life_support::add_patient(local_100);
                src_local.m_ptr._7_1_ = 1;
              }
              local_12c = (uint)bVar3;
              object::~object((object *)&local_100);
              if (local_12c != 0) goto LAB_0013ffe4;
              __gnu_cxx::
              __normal_iterator<_object_*(*const_*)(_object_*,__typeobject_*),_std::vector<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>_>
              ::operator++(&__end4);
            }
            gtype = (type_info *)this_local;
            bVar3 = try_direct_conversions((type_caster_generic *)srctype,(handle)this_local);
            if (bVar3) {
              src_local.m_ptr._7_1_ = 1;
              goto LAB_0013ffe4;
            }
          }
          if (((byte)this->typeinfo->field_0x90 >> 3 & 1) != 0) {
            std::type_index::type_index(&local_148,this->typeinfo->cpptype);
            local_140 = get_global_type_info(&local_148);
            if (local_140 != (type_info *)0x0) {
              this->typeinfo = local_140;
              src_local.m_ptr._7_1_ = load(this,(handle)this_local,false);
              goto LAB_0013ffe4;
            }
            local_140 = (type_info *)0x0;
          }
          src_local.m_ptr._7_1_ = try_load_foreign_module_local(this,(handle)this_local);
        }
      }
    }
  }
  else {
    src_local.m_ptr._7_1_ = 0;
  }
LAB_0013ffe4:
  return (bool)(src_local.m_ptr._7_1_ & 1);
}

Assistant:

PYBIND11_NOINLINE bool load_impl(handle src, bool convert) {
        if (!src) return false;
        if (!typeinfo) return try_load_foreign_module_local(src);
        if (src.is_none()) {
            // Defer accepting None to other overloads (if we aren't in convert mode):
            if (!convert) return false;
            value = nullptr;
            return true;
        }

        auto &this_ = static_cast<ThisT &>(*this);
        this_.check_holder_compat();

        PyTypeObject *srctype = Py_TYPE(src.ptr());

        // Case 1: If src is an exact type match for the target type then we can reinterpret_cast
        // the instance's value pointer to the target type:
        if (srctype == typeinfo->type) {
            this_.load_value(reinterpret_cast<instance *>(src.ptr())->get_value_and_holder());
            return true;
        }
        // Case 2: We have a derived class
        else if (PyType_IsSubtype(srctype, typeinfo->type)) {
            auto &bases = all_type_info(srctype);
            bool no_cpp_mi = typeinfo->simple_type;

            // Case 2a: the python type is a Python-inherited derived class that inherits from just
            // one simple (no MI) pybind11 class, or is an exact match, so the C++ instance is of
            // the right type and we can use reinterpret_cast.
            // (This is essentially the same as case 2b, but because not using multiple inheritance
            // is extremely common, we handle it specially to avoid the loop iterator and type
            // pointer lookup overhead)
            if (bases.size() == 1 && (no_cpp_mi || bases.front()->type == typeinfo->type)) {
                this_.load_value(reinterpret_cast<instance *>(src.ptr())->get_value_and_holder());
                return true;
            }
            // Case 2b: the python type inherits from multiple C++ bases.  Check the bases to see if
            // we can find an exact match (or, for a simple C++ type, an inherited match); if so, we
            // can safely reinterpret_cast to the relevant pointer.
            else if (bases.size() > 1) {
                for (auto base : bases) {
                    if (no_cpp_mi ? PyType_IsSubtype(base->type, typeinfo->type) : base->type == typeinfo->type) {
                        this_.load_value(reinterpret_cast<instance *>(src.ptr())->get_value_and_holder(base));
                        return true;
                    }
                }
            }

            // Case 2c: C++ multiple inheritance is involved and we couldn't find an exact type match
            // in the registered bases, above, so try implicit casting (needed for proper C++ casting
            // when MI is involved).
            if (this_.try_implicit_casts(src, convert))
                return true;
        }

        // Perform an implicit conversion
        if (convert) {
            for (auto &converter : typeinfo->implicit_conversions) {
                auto temp = reinterpret_steal<object>(converter(src.ptr(), typeinfo->type));
                if (load_impl<ThisT>(temp, false)) {
                    loader_life_support::add_patient(temp);
                    return true;
                }
            }
            if (this_.try_direct_conversions(src))
                return true;
        }

        // Failed to match local typeinfo. Try again with global.
        if (typeinfo->module_local) {
            if (auto gtype = get_global_type_info(*typeinfo->cpptype)) {
                typeinfo = gtype;
                return load(src, false);
            }
        }

        // Global typeinfo has precedence over foreign module_local
        return try_load_foreign_module_local(src);
    }